

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAHandleNFlag(IDAMem IDA_mem,int nflag,sunrealtype err_k,sunrealtype err_km1,long *ncfnPtr,
                  int *ncfPtr,long *netfPtr,int *nefPtr)

{
  double dVar1;
  int *in_RCX;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  long *in_R8;
  int *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  sunrealtype err_knew;
  double local_98;
  double local_90;
  double local_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  double local_60;
  double local_58;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x4c4) = 1;
  if (in_ESI == 7) {
    *in_R9 = *in_R9 + 1;
    *in_R8 = *in_R8 + 1;
    if (*in_R9 == 1) {
      local_60 = in_XMM1_Qa;
      if (*(int *)(in_RDI + 0x4b8) == *(int *)(in_RDI + 0x4c0)) {
        local_60 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
      }
      *(undefined4 *)(in_RDI + 0x4b8) = *(undefined4 *)(in_RDI + 0x4c0);
      dVar1 = pow(local_60 + local_60 + 0.0001,-1.0 / (double)(*(int *)(in_RDI + 0x4b8) + 1));
      *(double *)(in_RDI + 0x4f0) = dVar1 * 0.9;
      if (*(double *)(in_RDI + 0x4f0) <= *(double *)(in_RDI + 0x5a0)) {
        local_70 = *(double *)(in_RDI + 0x4f0);
      }
      else {
        local_70 = *(double *)(in_RDI + 0x5a0);
      }
      if (*(double *)(in_RDI + 0x5a8) <= local_70) {
        if (*(double *)(in_RDI + 0x4f0) <= *(double *)(in_RDI + 0x5a0)) {
          local_80 = *(undefined8 *)(in_RDI + 0x4f0);
        }
        else {
          local_80 = *(undefined8 *)(in_RDI + 0x5a0);
        }
        local_78 = local_80;
      }
      else {
        local_78 = *(undefined8 *)(in_RDI + 0x5a8);
      }
      *(undefined8 *)(in_RDI + 0x4f0) = local_78;
      if (*(double *)(in_RDI + 0x4f0) <=
          *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0))) {
        local_88 = *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0));
      }
      else {
        local_88 = *(double *)(in_RDI + 0x4f0);
      }
      *(double *)(in_RDI + 0x4f0) = local_88;
      *(double *)(in_RDI + 0x4e0) = *(double *)(in_RDI + 0x4f0) * *(double *)(in_RDI + 0x4e0);
      local_4 = 0x14;
    }
    else if (*in_R9 == 2) {
      *(undefined4 *)(in_RDI + 0x4b8) = *(undefined4 *)(in_RDI + 0x4c0);
      if (*(double *)(in_RDI + 0x5a8) <=
          *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0))) {
        local_90 = *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0));
      }
      else {
        local_90 = *(double *)(in_RDI + 0x5a8);
      }
      *(double *)(in_RDI + 0x4f0) = local_90;
      *(double *)(in_RDI + 0x4e0) = *(double *)(in_RDI + 0x4f0) * *(double *)(in_RDI + 0x4e0);
      local_4 = 0x14;
    }
    else if (*in_R9 < *(int *)(in_RDI + 0x55c)) {
      *(undefined4 *)(in_RDI + 0x4b8) = 1;
      if (*(double *)(in_RDI + 0x5a8) <=
          *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0))) {
        local_98 = *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0));
      }
      else {
        local_98 = *(double *)(in_RDI + 0x5a8);
      }
      *(double *)(in_RDI + 0x4f0) = local_98;
      *(double *)(in_RDI + 0x4e0) = *(double *)(in_RDI + 0x4f0) * *(double *)(in_RDI + 0x4e0);
      local_4 = 0x14;
    }
    else {
      local_4 = -3;
    }
  }
  else {
    *in_RCX = *in_RCX + 1;
    *in_RDX = *in_RDX + 1;
    if (in_ESI < 0) {
      if (in_ESI == -7) {
        local_4 = -7;
      }
      else if (in_ESI == -6) {
        local_4 = -6;
      }
      else if (in_ESI == -8) {
        local_4 = -8;
      }
      else if (in_ESI == -0xb) {
        local_4 = -0xb;
      }
      else if (in_ESI == -0x1f) {
        local_4 = -0x1f;
      }
      else if (in_ESI == -0x29) {
        local_4 = -0x29;
      }
      else if (in_ESI == -0x33) {
        local_4 = -0x33;
      }
      else {
        local_4 = -0x11;
      }
    }
    else if ((*in_RCX == *(int *)(in_RDI + 0x558)) ||
            (ABS(*(double *)(in_RDI + 0x4e0)) <= *(double *)(in_RDI + 0x578) * 1.000001)) {
      if (in_ESI == 1) {
        local_4 = -9;
      }
      else if (in_ESI == 10) {
        local_4 = -0x21;
      }
      else if (in_ESI == 0xb) {
        local_4 = -0x2a;
      }
      else if (in_ESI == 0xc) {
        local_4 = -0x35;
      }
      else if (in_ESI == 5) {
        local_4 = -0xb;
      }
      else {
        local_4 = -4;
      }
    }
    else {
      if (in_ESI != 5) {
        if (*(double *)(in_RDI + 0x5b0) <=
            *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0))) {
          local_58 = *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0));
        }
        else {
          local_58 = *(double *)(in_RDI + 0x5b0);
        }
        *(double *)(in_RDI + 0x4f0) = local_58;
      }
      *(double *)(in_RDI + 0x4e0) = *(double *)(in_RDI + 0x4f0) * *(double *)(in_RDI + 0x4e0);
      local_4 = 0x14;
    }
  }
  return local_4;
}

Assistant:

static int IDAHandleNFlag(IDAMem IDA_mem, int nflag, sunrealtype err_k,
                          sunrealtype err_km1, long int* ncfnPtr, int* ncfPtr,
                          long int* netfPtr, int* nefPtr)
{
  sunrealtype err_knew;

  IDA_mem->ida_phase = 1;

  if (nflag != ERROR_TEST_FAIL)
  {
    /*-----------------------
      Nonlinear solver failed
      -----------------------*/

    (*ncfPtr)++;  /* local counter for convergence failures */
    (*ncfnPtr)++; /* global counter for convergence failures */

    if (nflag < 0)
    { /* nonrecoverable failure */

      if (nflag == IDA_LSOLVE_FAIL) { return (IDA_LSOLVE_FAIL); }
      else if (nflag == IDA_LSETUP_FAIL) { return (IDA_LSETUP_FAIL); }
      else if (nflag == IDA_RES_FAIL) { return (IDA_RES_FAIL); }
      else if (nflag == IDA_CONSTR_FAIL) { return (IDA_CONSTR_FAIL); }
      else if (nflag == IDA_QRHS_FAIL) { return (IDA_QRHS_FAIL); }
      else if (nflag == IDA_SRES_FAIL) { return (IDA_SRES_FAIL); }
      else if (nflag == IDA_QSRHS_FAIL) { return (IDA_QSRHS_FAIL); }
      else { return (IDA_NLS_FAIL); }
    }
    else
    { /* recoverable failure    */

      /* Test if there were too many convergence failures or |h| = hmin */
      if ((*ncfPtr == IDA_mem->ida_maxncf) ||
          (SUNRabs(IDA_mem->ida_hh) <= IDA_mem->ida_hmin * ONEPSM))
      {
        if (nflag == IDA_RES_RECVR) { return (IDA_REP_RES_ERR); }
        if (nflag == IDA_QRHS_RECVR) { return (IDA_REP_QRHS_ERR); }
        if (nflag == IDA_SRES_RECVR) { return (IDA_REP_SRES_ERR); }
        if (nflag == IDA_QSRHS_RECVR) { return (IDA_REP_QSRHS_ERR); }
        if (nflag == IDA_CONSTR_RECVR) { return (IDA_CONSTR_FAIL); }
        return (IDA_CONV_FAIL);
      }

      /* Reduce step size for a new prediction
         Note that if nflag=IDA_CONSTR_RECVR then rr was already set in IDANls */
      if (nflag != IDA_CONSTR_RECVR)
      {
        IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_cf,
                                  IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      }
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      return (PREDICT_AGAIN);
    }
  }
  else
  {
    /*-----------------
      Error Test failed
      -----------------*/

    (*nefPtr)++;  /* local counter for error test failures */
    (*netfPtr)++; /* global counter for error test failures */

    if (*nefPtr == 1)
    {
      /* On first error test failure, keep current order or lower order by one.
         Compute new stepsize based on differences of the solution. */

      err_knew = (IDA_mem->ida_kk == IDA_mem->ida_knew) ? err_k : err_km1;

      IDA_mem->ida_kk  = IDA_mem->ida_knew;
      IDA_mem->ida_eta = PT9 * SUNRpowerR(TWO * err_knew + PT0001,
                                          -ONE / (IDA_mem->ida_kk + 1));
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                SUNMIN(IDA_mem->ida_eta_low, IDA_mem->ida_eta));
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "first-error-test_fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else if (*nefPtr == 2)
    {
      /* On second error test failure, use current order or decrease order by one.
         Reduce stepsize by factor of 1/4. */

      IDA_mem->ida_kk  = IDA_mem->ida_knew;
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "second-error-test-fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else if (*nefPtr < IDA_mem->ida_maxnef)
    {
      /* On third and subsequent error test failures, set order to 1.
         Reduce stepsize by factor of 1/4. */
      IDA_mem->ida_kk  = 1;
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "error-test-fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else
    {
      /* Too many error test failures */
      return (IDA_ERR_FAIL);
    }
  }
}